

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcProjectOrderRecord::IfcProjectOrderRecord(IfcProjectOrderRecord *this)

{
  *(undefined ***)&this->field_0x128 = &PTR__Object_00806870;
  *(undefined8 *)&this->field_0x130 = 0;
  *(char **)&this->field_0x138 = "IfcProjectOrderRecord";
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__0088d5e8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x88d508;
  *(undefined8 *)&this->field_0x128 = 0x88d5d0;
  *(undefined8 *)&this->field_0x88 = 0x88d530;
  *(undefined8 *)&this->field_0x98 = 0x88d558;
  *(undefined8 *)&this->field_0xd0 = 0x88d580;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>)._vptr_ObjectHelper
       = (_func_int **)0x88d5a8;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>).field_0x10 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>).field_0x18 = 0;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProjectOrderRecord,_2UL>).field_0x20 = 0;
  (this->PredefinedType)._M_dataplus._M_p = (pointer)&(this->PredefinedType).field_2;
  (this->PredefinedType)._M_string_length = 0;
  (this->PredefinedType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcProjectOrderRecord() : Object("IfcProjectOrderRecord") {}